

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O2

string * ApprovalTests::DiffInfo::getDefaultArguments_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  receivedFileTemplate_abi_cxx11_();
  ::std::operator+(&local_50,&local_30,' ');
  approvedFileTemplate_abi_cxx11_();
  ::std::operator+(in_RDI,&local_50,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string DiffInfo::getDefaultArguments()
    {
        return receivedFileTemplate() + ' ' + approvedFileTemplate();
    }